

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffainit(fitsfile *fptr,int *status)

{
  long lVar1;
  int iVar2;
  char local_218 [8];
  char errmsg [81];
  char local_1b8 [8];
  char message [81];
  char local_158 [8];
  char comm [73];
  char value [71];
  char local_b8 [8];
  char name [75];
  undefined1 *local_60;
  tcolumn *colptr;
  LONGLONG tbcoln;
  LONGLONG nrows;
  LONGLONG rowlen;
  LONGLONG pcount;
  long tfield;
  int local_28;
  int ntilebins;
  int nspace;
  int ii;
  int *status_local;
  fitsfile *fptr_local;
  
  local_60 = (undefined1 *)0x0;
  if (0 < *status) {
    return *status;
  }
  _nspace = status;
  status_local = &fptr->HDUposition;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  *(undefined4 *)(*(long *)(status_local + 2) + 0x58) = 1;
  *(undefined8 *)(*(long *)(status_local + 2) + 0x70) =
       *(undefined8 *)(*(long *)(status_local + 2) + 0x30);
  iVar2 = ffgttb((fitsfile *)status_local,&nrows,&tbcoln,&rowlen,&pcount,_nspace);
  if (0 < iVar2) {
    return *_nspace;
  }
  if (rowlen != 0) {
    ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
    snprintf(local_218,0x51,"  PCOUNT = %ld",rowlen);
    ffpmsg(local_218);
    *_nspace = 0xd6;
    return 0xd6;
  }
  *(LONGLONG *)(*(long *)(status_local + 2) + 0x3c8) = nrows;
  *(int *)(*(long *)(status_local + 2) + 0x3b0) = (int)pcount;
  if (*(long *)(*(long *)(status_local + 2) + 0x530) != 0) {
    tfield._4_4_ = (int)((*(long *)(*(long *)(status_local + 2) + 0x498) + -1) /
                        *(long *)(*(long *)(status_local + 2) + 0x440)) + 1;
    for (ntilebins = 0; ntilebins < tfield._4_4_; ntilebins = ntilebins + 1) {
      if (*(long *)(*(long *)(*(long *)(status_local + 2) + 0x548) + (long)ntilebins * 8) != 0) {
        free(*(void **)(*(long *)(*(long *)(status_local + 2) + 0x548) + (long)ntilebins * 8));
      }
      if (*(long *)(*(long *)(*(long *)(status_local + 2) + 0x550) + (long)ntilebins * 8) != 0) {
        free(*(void **)(*(long *)(*(long *)(status_local + 2) + 0x550) + (long)ntilebins * 8));
      }
    }
    free(*(void **)(*(long *)(status_local + 2) + 0x558));
    free(*(void **)(*(long *)(status_local + 2) + 0x540));
    free(*(void **)(*(long *)(status_local + 2) + 0x538));
    free(*(void **)(*(long *)(status_local + 2) + 0x550));
    free(*(void **)(*(long *)(status_local + 2) + 0x548));
    free(*(void **)(*(long *)(status_local + 2) + 0x530));
    *(undefined8 *)(*(long *)(status_local + 2) + 0x558) = 0;
    *(undefined8 *)(*(long *)(status_local + 2) + 0x540) = 0;
    *(undefined8 *)(*(long *)(status_local + 2) + 0x538) = 0;
    *(undefined8 *)(*(long *)(status_local + 2) + 0x550) = 0;
    *(undefined8 *)(*(long *)(status_local + 2) + 0x548) = 0;
    *(undefined8 *)(*(long *)(status_local + 2) + 0x530) = 0;
  }
  if (*(long *)(*(long *)(status_local + 2) + 0x3d0) != 0) {
    free(*(void **)(*(long *)(status_local + 2) + 0x3d0));
  }
  if ((0 < pcount) && (local_60 = (undefined1 *)calloc(pcount,0xa0), local_60 == (undefined1 *)0x0))
  {
    ffpmsg("malloc failed to get memory for FITS table descriptors (ffainit)");
    *(undefined8 *)(*(long *)(status_local + 2) + 0x3d0) = 0;
    *_nspace = 0x6f;
    return 0x6f;
  }
  *(undefined1 **)(*(long *)(status_local + 2) + 0x3d0) = local_60;
  for (ntilebins = 0; ntilebins < pcount; ntilebins = ntilebins + 1) {
    *local_60 = 0;
    *(undefined8 *)(local_60 + 0x60) = 0x3ff0000000000000;
    *(undefined8 *)(local_60 + 0x68) = 0;
    local_60[0x78] = 1;
    *(undefined8 *)(local_60 + 0x48) = 0xffffffffffffffff;
    *(undefined4 *)(local_60 + 0x50) = 0xffffd8f1;
    local_60 = local_60 + 0xa0;
  }
  *(LONGLONG *)(*(long *)(status_local + 2) + 0x3c0) = tbcoln;
  *(LONGLONG *)(*(long *)(status_local + 2) + 0x3b8) = tbcoln;
  *(LONGLONG *)(*(long *)(status_local + 2) + 0x3d8) = nrows * tbcoln;
  *(undefined8 *)(*(long *)(status_local + 2) + 0x3e0) = 0;
  *(undefined4 *)(*(long *)(status_local + 2) + 0x47c) = 0;
  local_28 = 0;
  ntilebins = 8;
  do {
    ffgkyn((fitsfile *)status_local,ntilebins,local_b8,comm + 0x48,local_158,_nspace);
    if (*_nspace == 0xcd) {
      strcat(comm + 0x48,"\'");
      *_nspace = 0;
    }
    else if (*_nspace == 0xcf) {
      *_nspace = 0;
    }
    if (*_nspace == 0x6b) {
      ffpmsg("END keyword not found in ASCII table header (ffainit).");
      *_nspace = 0xd2;
      return 0xd2;
    }
    if (0 < *_nspace) {
      return *_nspace;
    }
    if (local_b8[0] == 'T') {
      ffgtbp((fitsfile *)status_local,local_b8,comm + 0x48,_nspace);
    }
    else if ((('D' < local_b8[0]) && (local_b8[0] < 'F')) &&
            (iVar2 = strcmp(local_b8,"END"), iVar2 == 0)) {
      local_60 = *(undefined1 **)(*(long *)(status_local + 2) + 0x3d0);
      ntilebins = 0;
      while( true ) {
        if (pcount <= ntilebins) {
          *(long *)(*(long *)(status_local + 2) + 0x70) =
               *(long *)(*(long *)(status_local + 2) + 0x80) - (long)((local_28 + 1) * 0x50);
          *(long *)(*(long *)(status_local + 2) + 0x88) =
               ((*(long *)(*(long *)(status_local + 2) + 0x80) + -0x50) / 0xb40 + 1) * 0xb40;
          *(long *)(*(long *)(*(long *)(status_local + 2) + 0x68) +
                   (long)(*(int *)(*(long *)(status_local + 2) + 0x54) + 1) * 8) =
               *(long *)(*(long *)(status_local + 2) + 0x88) +
               ((nrows * tbcoln + 0xb3f) / 0xb40) * 0xb40;
          *(undefined8 *)(*(long *)(status_local + 2) + 0x80) =
               *(undefined8 *)
                (*(long *)(*(long *)(status_local + 2) + 0x68) +
                (long)*(int *)(*(long *)(status_local + 2) + 0x54) * 8);
          return *_nspace;
        }
        lVar1 = *(long *)((long)local_60 + 0x48);
        if (*(int *)((long)local_60 + 0x50) == -9999) {
          ffkeyn("TFORM",ntilebins + 1,local_b8,_nspace);
          snprintf(local_1b8,0x51,"Required %s keyword not found (ffainit).",local_b8);
          ffpmsg(local_1b8);
          *_nspace = 0xe8;
          return 0xe8;
        }
        if (lVar1 == -1) {
          ffkeyn("TBCOL",ntilebins + 1,local_b8,_nspace);
          snprintf(local_1b8,0x51,"Required %s keyword not found (ffainit).",local_b8);
          ffpmsg(local_1b8);
          *_nspace = 0xe7;
          return 0xe7;
        }
        if ((*(long *)(*(long *)(status_local + 2) + 0x3c8) != 0) &&
           ((lVar1 < 0 || (*(long *)(*(long *)(status_local + 2) + 0x3c8) <= lVar1)))) break;
        if ((*(long *)(*(long *)(status_local + 2) + 0x3c8) != 0) &&
           (*(long *)(*(long *)(status_local + 2) + 0x3c8) <
            lVar1 + *(long *)((long)local_60 + 0x98))) {
          snprintf(local_1b8,0x51,"Column %d is too wide to fit in table (ffainit)",
                   (ulong)(ntilebins + 1));
          ffpmsg(local_1b8);
          snprintf(local_1b8,0x51," TFORM = %s and NAXIS1 = %ld",(long)local_60 + 0x8c,
                   *(undefined8 *)(*(long *)(status_local + 2) + 0x3c8));
          ffpmsg(local_1b8);
          *_nspace = 0xec;
          return 0xec;
        }
        ntilebins = ntilebins + 1;
        local_60 = (undefined1 *)((long)local_60 + 0xa0);
      }
      ffkeyn("TBCOL",ntilebins + 1,local_b8,_nspace);
      snprintf(local_1b8,0x51,"Value of %s keyword out of range: %ld (ffainit).",local_b8,lVar1);
      ffpmsg(local_1b8);
      *_nspace = 0xea;
      return 0xea;
    }
    if (((local_b8[0] == '\0') && (comm[0x48] == '\0')) && (local_158[0] == '\0')) {
      local_28 = local_28 + 1;
    }
    else {
      local_28 = 0;
    }
    ntilebins = ntilebins + 1;
  } while( true );
}

Assistant:

int ffainit(fitsfile *fptr,      /* I - FITS file pointer */
            int *status)         /* IO - error status     */
{
/*
  initialize the parameters defining the structure of an ASCII table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, tbcoln;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG], errmsg[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* set that this is an ASCII table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is a valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)  
       return(*status);

    if (pcount != 0)
    {
       ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
       snprintf(errmsg, FLEN_ERRMSG,"  PCOUNT = %ld", (long) pcount);
       ffpmsg(errmsg);
       return(*status = BAD_PCOUNT);
    }

    (fptr->Fptr)->rowlength = rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0 */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffainit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /*  initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->strnull[0] = ASCII_NULL_UNDEFINED;  /* null value undefined */
        colptr->tbcol = -1;          /* initialize to illegal value */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
    }

    /*
      Initialize the fictitious heap starting address (immediately following
      the table data) and a zero length heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
      There is no special data following an ASCII table.
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in ASCII table header (ffainit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;

        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0;
    }

    /* test that all required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        tbcoln = colptr->tbcol;  /* the starting column number (zero based) */

        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }

        else if (tbcoln == -1)
        {
            ffkeyn("TBCOL", ii+1, name, status); /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                (tbcoln < 0 || tbcoln >= (fptr->Fptr)->rowlength ) )
        {
            ffkeyn("TBCOL", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Value of %s keyword out of range: %ld (ffainit).",
            name, (long) tbcoln);
            ffpmsg(message);
            return(*status = BAD_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                 tbcoln + colptr->twidth > (fptr->Fptr)->rowlength )
        {
            snprintf(message,FLEN_ERRMSG,"Column %d is too wide to fit in table (ffainit)",
            ii+1);
            ffpmsg(message);
            snprintf(message, FLEN_ERRMSG," TFORM = %s and NAXIS1 = %ld",
                    colptr->tform, (long) (fptr->Fptr)->rowlength);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart +
         ( ((LONGLONG)rowlen * nrows + 2879) / 2880 * 2880 );

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}